

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame_dec.c
# Opt level: O0

int VP8InitFrame(VP8Decoder *dec,VP8Io *io)

{
  int iVar1;
  VP8Decoder *in_RSI;
  VP8Decoder *in_RDI;
  VP8Decoder *in_stack_00000078;
  undefined4 local_4;
  
  iVar1 = InitThreadContext(in_RSI);
  if (iVar1 == 0) {
    local_4 = 0;
  }
  else {
    iVar1 = AllocateMemory(in_stack_00000078);
    if (iVar1 == 0) {
      local_4 = 0;
    }
    else {
      InitIo(in_RDI,(VP8Io *)in_RSI);
      VP8DspInit();
      local_4 = 1;
    }
  }
  return local_4;
}

Assistant:

int VP8InitFrame(VP8Decoder* const dec, VP8Io* const io) {
  if (!InitThreadContext(dec)) return 0;  // call first. Sets dec->num_caches_.
  if (!AllocateMemory(dec)) return 0;
  InitIo(dec, io);
  VP8DspInit();  // Init critical function pointers and look-up tables.
  return 1;
}